

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.h
# Opt level: O0

void __thiscall CTextCursor::Set(CTextCursor *this,float FontSize,float x,float y,int Flags)

{
  undefined4 in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  vector2_base<float> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined4 *)(in_RDI + 0x48) = in_XMM0_Da;
  *(undefined4 *)(in_RDI + 0x4c) = 1;
  *(undefined4 *)(in_RDI + 0x50) = 0xbf800000;
  vector2_base<float>::vector2_base(&local_10,in_XMM1_Da,in_XMM2_Da);
  *(vector2_base<float> *)(in_RDI + 0x18) = local_10;
  *(undefined4 *)(in_RDI + 0x5c) = 0;
  *(undefined4 *)(in_RDI + 0x54) = 0;
  *(undefined4 *)(in_RDI + 0x58) = in_ESI;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Set(float FontSize, float x, float y, int Flags)
	{
		m_FontSize = FontSize;
		m_MaxLines = 1;
		m_MaxWidth = -1.0f;
		m_CursorPos = vec2(x, y);
		m_LineSpacing = 0.0f;
		m_Align = 0; // Top Left
		m_Flags = Flags;
	}